

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pic.c
# Opt level: O0

void sysbvm_pic_addSelectorTypeAndMethod
               (sysbvm_pic_t *pic,sysbvm_tuple_t selector,sysbvm_tuple_t type,sysbvm_tuple_t method)

{
  uint sequence_00;
  sysbvm_picEntry_t *psVar1;
  sysbvm_picEntry_t *entry;
  uint entryIndex;
  uint sequence;
  sysbvm_tuple_t method_local;
  sysbvm_tuple_t type_local;
  sysbvm_tuple_t selector_local;
  sysbvm_pic_t *pic_local;
  
  sequence_00 = sysbvm_pic_writeLock(pic);
  psVar1 = pic->entries + (sequence_00 & 3);
  psVar1->type = type;
  psVar1->selector = selector;
  psVar1->method = method;
  sysbvm_pic_writeUnlock(pic,sequence_00);
  return;
}

Assistant:

SYSBVM_API void sysbvm_pic_addSelectorTypeAndMethod(sysbvm_pic_t *pic, sysbvm_tuple_t selector, sysbvm_tuple_t type, sysbvm_tuple_t method)
{
    unsigned int sequence = sysbvm_pic_writeLock(pic);
    unsigned int entryIndex = sequence % SYSBVM_PIC_ENTRY_COUNT;
    sysbvm_picEntry_t *entry = pic->entries + entryIndex;
    entry->type = type;
    entry->selector = selector;
    entry->method = method;

    sysbvm_pic_writeUnlock(pic, sequence);
}